

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_lights.cxx
# Opt level: O3

void __thiscall xray_re::xr_build_lights::load(xr_build_lights *this,xr_reader *r)

{
  size_t sVar1;
  uint32_t id;
  uint32_t find_id;
  xr_build_lights *this_00;
  bool cs;
  byte bVar2;
  
  find_id = 0;
  bVar2 = 1;
  cs = true;
  do {
    this_00 = (xr_build_lights *)r;
    sVar1 = xr_reader::find_chunk(r,find_id);
    if (sVar1 != 0) {
      bVar2 = bVar2 & (sVar1 * -0x70a3d70a3d70a3d7 >> 2 | sVar1 * -0x70a3d70a3d70a3d7 << 0x3e) <
                      0x28f5c28f5c28f5d;
      cs = (bool)(cs & (sVar1 * 0x4ec4ec4ec4ec4ec5 >> 3 | sVar1 * 0x4ec4ec4ec4ec4ec5 << 0x3d) <
                       0x276276276276277);
    }
    find_id = find_id + 1;
  } while (find_id != 3);
  if (bVar2 != 0 || cs != false) {
    if ((bVar2 & cs) != 0) {
      msg("can\'t autodetect build.lights version");
      return;
    }
    read_lights(this_00,r,0,&this->m_rgb,cs);
    read_lights(this_00,r,1,&this->m_hemi,cs);
    read_lights(this_00,r,2,&this->m_sun,cs);
    return;
  }
  __assert_fail("can_be_soc || can_be_cs",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_build_lights.cxx"
                ,0x19,"void xray_re::xr_build_lights::load(xr_reader &)");
}

Assistant:

void xr_build_lights::load(xr_reader& r)
{
	bool can_be_soc = true, can_be_cs = true;
	for (uint32_t id = BL_CHUNK_RGB; id <= BL_CHUNK_SUN; ++id) {
		if (size_t size = r.find_chunk(id)) {
			if (size % R_LIGHT_SIZE_SOC)
				can_be_soc = false;
			if (size % R_LIGHT_SIZE_CS)
				can_be_cs = false;
		}
	}
	xr_assert(can_be_soc || can_be_cs);
	if (can_be_soc && can_be_cs) {
		msg("can't autodetect build.lights version");
		return;
	}
	read_lights(r, BL_CHUNK_RGB, m_rgb, can_be_cs);
	read_lights(r, BL_CHUNK_HEMI, m_hemi, can_be_cs);
	read_lights(r, BL_CHUNK_SUN, m_sun, can_be_cs);
}